

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLproxycode
Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,Curl_easy *data,
           _Bool *done)

{
  uchar **ppuVar1;
  undefined1 *puVar2;
  curl_proxytype cVar3;
  connect_t cVar4;
  connectdata *pcVar5;
  uchar *puVar6;
  sockaddr *psVar7;
  bool bVar8;
  resolve_t rVar9;
  CURLcode CVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  CURLproxycode extraout_EDX;
  CURLproxycode extraout_EDX_00;
  CURLproxycode extraout_EDX_01;
  CURLproxycode extraout_EDX_02;
  Curl_addrinfo *ai;
  Curl_dns_entry *dns;
  curl_socket_t local_84;
  ssize_t written;
  ssize_t actualread;
  
  pcVar5 = data->conn;
  cVar3 = (pcVar5->socks_proxy).proxytype;
  puVar6 = (uchar *)(data->state).buffer;
  local_84 = pcVar5->sock[sockindex];
  dns = (Curl_dns_entry *)0x0;
  cVar4 = (pcVar5->cnnct).state;
  if (((0xf < cVar4 - CONNECT_SOCKS_INIT) && (cVar4 != CONNECT_SOCKS_INIT)) && (*done == false)) {
    (pcVar5->cnnct).state = CONNECT_SOCKS_INIT;
  }
  switch((pcVar5->cnnct).state) {
  case CONNECT_SOCKS_INIT:
    pcVar5->ip_version = '\x01';
    if (((pcVar5->bits).field_0x4 & 1) != 0) {
      pcVar12 = "";
      if (cVar3 == CURLPROXY_SOCKS4A) {
        pcVar12 = "a";
      }
      Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar12,hostname,
                 (ulong)(uint)remote_port);
    }
    Curl_infof(data,"SOCKS4 communication to %s:%d",hostname);
    puVar6[0] = '\x04';
    puVar6[1] = '\x01';
    puVar6[2] = (uchar)((uint)remote_port >> 8);
    puVar6[3] = (uchar)remote_port;
    if (cVar3 != CURLPROXY_SOCKS4A) {
      bVar8 = false;
      rVar9 = Curl_resolv(data,hostname,remote_port,false,&dns);
      if (rVar9 == CURLRESOLV_ERROR) {
        remote_port = CURLPX_RESOLVE_HOST;
      }
      else if (rVar9 == CURLRESOLV_PENDING) {
        if ((data->conn->cnnct).state != CONNECT_RESOLVING) {
          (data->conn->cnnct).state = CONNECT_RESOLVING;
        }
        bVar8 = false;
        Curl_infof(data,"SOCKS4 non-blocking resolve of %s",hostname);
        remote_port = CURLPX_OK;
      }
      else {
        bVar8 = true;
        remote_port = extraout_EDX_01;
        if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
          (data->conn->cnnct).state = CONNECT_RESOLVED;
        }
      }
      if (!bVar8) {
        return remote_port;
      }
      goto switchD_0014184a_caseD_b;
    }
    remote_port = extraout_EDX;
    if ((data->conn->cnnct).state != CONNECT_REQ_INIT) {
      (data->conn->cnnct).state = CONNECT_REQ_INIT;
    }
    break;
  default:
    goto switchD_0014184a_caseD_2;
  case CONNECT_SOCKS_READ:
    goto switchD_0014184a_caseD_4;
  case CONNECT_REQ_INIT:
    break;
  case CONNECT_RESOLVING:
    dns = Curl_fetch_addr(data,hostname,pcVar5->port);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar10 = Curl_resolv_check(data,&dns);
      remote_port = extraout_EDX_02;
      if (dns == (Curl_dns_entry *)0x0) {
        if (CVar10 != CURLE_OK) {
          return CURLPX_RESOLVE_HOST;
        }
        return CURLPX_OK;
      }
    }
    else {
      (data->state).async.dns = dns;
      puVar2 = &(data->state).async.field_0x28;
      *puVar2 = *puVar2 | 1;
      Curl_infof(data,"Hostname \'%s\' was found",hostname);
      remote_port = extraout_EDX_00;
      if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
        (data->conn->cnnct).state = CONNECT_RESOLVED;
      }
    }
  case CONNECT_RESOLVED:
switchD_0014184a_caseD_b:
    if (dns == (Curl_dns_entry *)0x0) {
      pcVar12 = "Failed to resolve \"%s\" for SOCKS4 connect.";
    }
    else {
      for (ai = dns->addr; ai != (Curl_addrinfo *)0x0; ai = ai->ai_next) {
        if (ai->ai_family == 2) {
          Curl_printable_address(ai,(char *)&actualread,0x40);
          psVar7 = ai->ai_addr;
          puVar6[4] = psVar7->sa_data[2];
          puVar6[5] = psVar7->sa_data[3];
          puVar6[6] = psVar7->sa_data[4];
          puVar6[7] = psVar7->sa_data[5];
          bVar8 = false;
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",&actualread);
          Curl_resolv_unlock(data,dns);
          goto LAB_00141a26;
        }
      }
      pcVar12 = "SOCKS4 connection to %s not supported";
    }
    Curl_failf(data,pcVar12,hostname);
    bVar8 = true;
LAB_00141a26:
    if (bVar8) {
      return CURLPX_RESOLVE_HOST;
    }
    break;
  case CONNECT_REQ_SENDING:
    goto switchD_0014184a_caseD_e;
  }
  puVar6[8] = '\0';
  if (proxy_user != (char *)0x0) {
    sVar11 = strlen(proxy_user);
    if ((data->set).buffer_size - 8U <= sVar11) {
      Curl_failf(data,"Too long SOCKS proxy user name, can\'t use!");
      return CURLPX_LONG_USER;
    }
    memcpy(puVar6 + 8,proxy_user,sVar11 + 1);
  }
  sVar11 = strlen((char *)(puVar6 + 8));
  lVar13 = sVar11 + 9;
  if (cVar3 == CURLPROXY_SOCKS4A) {
    puVar6[4] = '\0';
    puVar6[5] = '\0';
    puVar6[6] = '\0';
    puVar6[7] = '\x01';
    sVar11 = strlen(hostname);
    if (sVar11 + 1 < 0x100) {
      strcpy((char *)(puVar6 + lVar13),hostname);
      lVar13 = lVar13 + sVar11 + 1;
      goto LAB_00141b2e;
    }
    Curl_failf(data,"SOCKS4: too long host name");
    remote_port = CURLPX_LONG_HOSTNAME;
    bVar8 = false;
  }
  else {
LAB_00141b2e:
    (pcVar5->cnnct).outp = puVar6;
    (pcVar5->cnnct).outstanding = lVar13;
    bVar8 = true;
    if ((data->conn->cnnct).state != CONNECT_REQ_SENDING) {
      (data->conn->cnnct).state = CONNECT_REQ_SENDING;
    }
  }
  if (bVar8) {
switchD_0014184a_caseD_e:
    CVar10 = Curl_write_plain(data,local_84,(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                              &written);
    if ((CVar10 == CURLE_OK) || (CVar10 == CURLE_AGAIN)) {
      lVar13 = (pcVar5->cnnct).outstanding - written;
      if (lVar13 == 0) {
        (pcVar5->cnnct).outstanding = 8;
        (pcVar5->cnnct).outp = puVar6;
        if ((data->conn->cnnct).state != CONNECT_SOCKS_READ) {
          (data->conn->cnnct).state = CONNECT_SOCKS_READ;
        }
switchD_0014184a_caseD_4:
        CVar10 = Curl_read_plain(local_84,(char *)(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                                 &actualread);
        if ((CVar10 != CURLE_OK) && (CVar10 != CURLE_AGAIN)) {
          pcVar12 = curl_easy_strerror(CVar10);
          Curl_failf(data,"SOCKS4: Failed receiving connect request ack: %s",pcVar12);
          return CURLPX_RECV_CONNECT;
        }
        if (actualread == 0 && CVar10 == CURLE_OK) {
          Curl_failf(data,"connection to proxy closed");
          return CURLPX_CLOSED;
        }
        lVar13 = (pcVar5->cnnct).outstanding - actualread;
        written = actualread;
        if (lVar13 == 0) {
          if ((data->conn->cnnct).state != CONNECT_DONE) {
            (data->conn->cnnct).state = CONNECT_DONE;
          }
switchD_0014184a_caseD_2:
          if (*puVar6 != '\0') {
            Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
            return CURLPX_BAD_VERSION;
          }
          switch(puVar6[1]) {
          case 'Z':
            goto switchD_00141cb1_caseD_5a;
          case '[':
            Curl_failf(data,
                       "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                       ,(ulong)puVar6[4],(ulong)puVar6[5],(ulong)puVar6[6],(ulong)puVar6[7],
                       (ulong)(ushort)(*(ushort *)(puVar6 + 2) << 8 | *(ushort *)(puVar6 + 2) >> 8),
                       0x5b);
            return CURLPX_REQUEST_FAILED;
          case '\\':
            Curl_failf(data,
                       "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                       ,(ulong)puVar6[4],(ulong)puVar6[5],(ulong)puVar6[6],(ulong)puVar6[7],
                       (ulong)(ushort)(*(ushort *)(puVar6 + 2) << 8 | *(ushort *)(puVar6 + 2) >> 8),
                       0x5c);
            return CURLPX_IDENTD;
          case ']':
            Curl_failf(data,
                       "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                       ,(ulong)puVar6[4],(ulong)puVar6[5],(ulong)puVar6[6],(ulong)puVar6[7],
                       (ulong)(ushort)(*(ushort *)(puVar6 + 2) << 8 | *(ushort *)(puVar6 + 2) >> 8),
                       0x5d);
            return CURLPX_IDENTD_DIFFER;
          default:
            Curl_failf(data,"Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                       (ulong)puVar6[4],(ulong)puVar6[5],(ulong)puVar6[6],(ulong)puVar6[7],
                       (ulong)(ushort)(*(ushort *)(puVar6 + 2) << 8 | *(ushort *)(puVar6 + 2) >> 8),
                       (ulong)puVar6[1]);
            return CURLPX_UNKNOWN_FAIL;
          }
        }
      }
      (pcVar5->cnnct).outstanding = lVar13;
      ppuVar1 = &(pcVar5->cnnct).outp;
      *ppuVar1 = *ppuVar1 + written;
      remote_port = CURLPX_OK;
    }
    else {
      Curl_failf(data,"Failed to send SOCKS4 connect request.");
      remote_port = CURLPX_SEND_CONNECT;
    }
  }
  return remote_port;
switchD_00141cb1_caseD_5a:
  pcVar12 = "";
  if (cVar3 == CURLPROXY_SOCKS4A) {
    pcVar12 = "a";
  }
  Curl_infof(data,"SOCKS4%s request granted.",pcVar12);
  *done = true;
  return CURLPX_OK;
}

Assistant:

CURLproxycode Curl_SOCKS4(const char *proxy_user,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  struct connectdata *conn = data->conn;
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;
  ssize_t actualread;
  ssize_t written;

  /* make sure that the buffer is at least 600 bytes */
  DEBUGASSERT(READBUFFER_MIN >= 600);

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    /* SOCKS4 can only do IPv4, insist! */
    conn->ip_version = CURL_IPRESOLVE_V4;
    if(conn->bits.httpproxy)
      infof(data, "SOCKS4%s: connecting to HTTP proxy %s port %d",
            protocol4a ? "a" : "", hostname, remote_port);

    infof(data, "SOCKS4 communication to %s:%d", hostname, remote_port);

    /*
     * Compose socks4 request
     *
     * Request format
     *
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     * # of bytes:  1    1      2              4           variable       1
     */

    socksreq[0] = 4; /* version (SOCKS4) */
    socksreq[1] = 1; /* connect */
    socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
    socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

    /* DNS resolve only for SOCKS4, not SOCKS4a */
    if(!protocol4a) {
      enum resolve_t rc =
        Curl_resolv(data, hostname, remote_port, FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;
      else if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        infof(data, "SOCKS4 non-blocking resolve of %s", hostname);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }

    /* socks4a doesn't resolve anything locally */
    sxstate(data, CONNECT_REQ_INIT);
    goto CONNECT_REQ_INIT;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, (int)conn->port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "Hostname '%s' was found", hostname);
      sxstate(data, CONNECT_RESOLVED);
    }
    else {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns) {
      hp = dns->addr;

      /* scan for the first IPv4 address */
      while(hp && (hp->ai_family != AF_INET))
        hp = hp->ai_next;

      if(hp) {
        struct sockaddr_in *saddr_in;
        char buf[64];
        Curl_printable_address(hp, buf, sizeof(buf));

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)", buf);

        Curl_resolv_unlock(data, dns); /* not used anymore from now on */
      }
      else
        failf(data, "SOCKS4 connection to %s not supported", hostname);
    }
    else
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);

    if(!hp)
      return CURLPX_RESOLVE_HOST;
  }
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    /*
     * This is currently not supporting "Identification Protocol (RFC1413)".
     */
    socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
    if(proxy_user) {
      size_t plen = strlen(proxy_user);
      if(plen >= (size_t)data->set.buffer_size - 8) {
        failf(data, "Too long SOCKS proxy user name, can't use!");
        return CURLPX_LONG_USER;
      }
      /* copy the proxy name WITH trailing zero */
      memcpy(socksreq + 8, proxy_user, plen + 1);
    }

    /*
     * Make connection
     */
    {
      size_t packetsize = 9 +
        strlen((char *)socksreq + 8); /* size including NUL */

      /* If SOCKS4a, set special invalid IP address 0.0.0.x */
      if(protocol4a) {
        size_t hostnamelen = 0;
        socksreq[4] = 0;
        socksreq[5] = 0;
        socksreq[6] = 0;
        socksreq[7] = 1;
        /* append hostname */
        hostnamelen = strlen(hostname) + 1; /* length including NUL */
        if(hostnamelen <= 255)
          strcpy((char *)socksreq + packetsize, hostname);
        else {
          failf(data, "SOCKS4: too long host name");
          return CURLPX_LONG_HOSTNAME;
        }
        packetsize += hostnamelen;
      }
      sx->outp = socksreq;
      sx->outstanding = packetsize;
      sxstate(data, CONNECT_REQ_SENDING);
    }
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    /* Send request */
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }

    /* done sending! */
    sx->outstanding = 8; /* receive data size */
    sx->outp = socksreq;
    sxstate(data, CONNECT_SOCKS_READ);

    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    /* Receive response */
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "SOCKS4: Failed receiving connect request ack: %s",
            curl_easy_strerror(result));
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
    break;
  default: /* lots of unused states in SOCKS4 */
    break;
  }

  /*
   * Response format
   *
   *     +----+----+----+----+----+----+----+----+
   *     | VN | CD | DSTPORT |      DSTIP        |
   *     +----+----+----+----+----+----+----+----+
   * # of bytes:  1    1      2              4
   *
   * VN is the version of the reply code and should be 0. CD is the result
   * code with one of the following values:
   *
   * 90: request granted
   * 91: request rejected or failed
   * 92: request rejected because SOCKS server cannot connect to
   *     identd on the client
   * 93: request rejected because the client program and identd
   *     report different user-ids
   */

  /* wrong version ? */
  if(socksreq[0]) {
    failf(data,
          "SOCKS4 reply has wrong version, version should be 0.");
    return CURLPX_BAD_VERSION;
  }

  /* Result */
  switch(socksreq[1]) {
  case 90:
    infof(data, "SOCKS4%s request granted.", protocol4a?"a":"");
    break;
  case 91:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected or failed.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_REQUEST_FAILED;
  case 92:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because SOCKS server cannot connect to "
          "identd on the client.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD;
  case 93:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because the client program and identd "
          "report different user-ids.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD_DIFFER;
  default:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", Unknown.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_UNKNOWN_FAIL;
  }

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}